

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::
BinaryExpr<const_std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>_&,_const_std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>_&>
::streamReconstructedExpression
          (BinaryExpr<const_std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>_&,_const_std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>_&>
           *this,ostream *os)

{
  string *lhs;
  char *pcVar1;
  __normal_iterator<CLI::App_*const_*,_std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>_> in_RCX
  ;
  string *in_R9;
  StringRef op;
  string local_60;
  string local_40;
  
  Detail::
  rangeToString<__gnu_cxx::__normal_iterator<CLI::App*const*,std::vector<CLI::App*,std::allocator<CLI::App*>>>,__gnu_cxx::__normal_iterator<CLI::App*const*,std::vector<CLI::App*,std::allocator<CLI::App*>>>>
            (&local_40,
             (Detail *)
             (this->m_lhs->super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<CLI::App_*const_*,_std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>_>
              )(this->m_lhs->super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>)._M_impl.
               super__Vector_impl_data._M_finish,in_RCX);
  lhs = (string *)(this->m_op).m_start;
  pcVar1 = (char *)(this->m_op).m_size;
  Detail::
  rangeToString<__gnu_cxx::__normal_iterator<CLI::App*const*,std::vector<CLI::App*,std::allocator<CLI::App*>>>,__gnu_cxx::__normal_iterator<CLI::App*const*,std::vector<CLI::App*,std::allocator<CLI::App*>>>>
            (&local_60,
             (Detail *)
             (this->m_rhs->super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<CLI::App_*const_*,_std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>_>
              )(this->m_rhs->super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>)._M_impl.
               super__Vector_impl_data._M_finish,in_RCX);
  op.m_size = (size_type)&local_60;
  op.m_start = pcVar1;
  formatReconstructedExpression((Catch *)os,(ostream *)&local_40,lhs,op,in_R9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }